

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O2

void __thiscall lunasvg::parseInlineStyle(lunasvg *this,string_view input,SVGElement *element)

{
  bool bVar1;
  PropertyID id;
  string_view input_local;
  string_view local_80;
  string value;
  string name;
  
  input_local._M_str = (char *)input._M_len;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  input_local._M_len = (size_t)this;
  skipOptionalSpaces(&input_local);
  while( true ) {
    bVar1 = readCSSIdentifier(&input_local,&name);
    if (!bVar1) break;
    skipOptionalSpaces(&input_local);
    if ((input_local._M_len == 0) || (*input_local._M_str != ':')) break;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    while ((input_local._M_str = input_local._M_str + 1, input_local._M_len = input_local._M_len - 1
           , input_local._M_len != 0 && (*input_local._M_str != ';'))) {
      std::__cxx11::string::push_back((char)&value);
    }
    local_80._M_len = name._M_string_length;
    local_80._M_str = name._M_dataplus._M_p;
    id = csspropertyid(&local_80);
    if (id != Unknown) {
      SVGElement::setAttribute((SVGElement *)input._M_str,0x100,id,&value);
    }
    skipOptionalSpacesOrDelimiter(&input_local,';');
    std::__cxx11::string::~string((string *)&value);
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

inline void parseInlineStyle(std::string_view input, SVGElement* element)
{
    std::string name;
    skipOptionalSpaces(input);
    while(readCSSIdentifier(input, name)) {
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, ':'))
            return;
        std::string value;
        while(!input.empty() && input.front() != ';') {
            value.push_back(input.front());
            input.remove_prefix(1);
        }

        auto id = csspropertyid(name);
        if(id != PropertyID::Unknown)
            element->setAttribute(0x100, id, value);
        skipOptionalSpacesOrDelimiter(input, ';');
    }
}